

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# blend_a64_mask_sse4.c
# Opt level: O3

void blend_a64_mask_b12_sx_sy_w8n_sse4_1
               (uint16_t *dst,uint32_t dst_stride,uint16_t *src0,uint32_t src0_stride,uint16_t *src1
               ,uint32_t src1_stride,uint8_t *mask,uint32_t mask_stride,int w,int h)

{
  uint8_t *puVar1;
  uint8_t *puVar2;
  uint16_t *puVar3;
  undefined1 auVar4 [16];
  uint8_t *puVar5;
  long lVar6;
  undefined1 in_XMM4 [16];
  undefined1 auVar7 [16];
  short sVar8;
  short sVar10;
  short sVar11;
  short sVar12;
  short sVar13;
  short sVar14;
  short sVar15;
  undefined1 auVar9 [16];
  short sVar16;
  uint16_t uVar17;
  uint16_t uVar25;
  uint16_t uVar26;
  uint16_t uVar27;
  uint16_t uVar28;
  uint16_t uVar29;
  uint16_t uVar30;
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  uint16_t uVar31;
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  
  auVar4 = _DAT_004ce3a0;
  puVar5 = mask + mask_stride;
  auVar7 = pmovsxbw(in_XMM4,0x4040404040404040);
  do {
    if (0 < w) {
      lVar6 = 0;
      do {
        puVar1 = mask + lVar6 * 2;
        puVar2 = puVar5 + lVar6 * 2;
        auVar32[0] = *puVar2 + *puVar1;
        auVar32[1] = puVar2[1] + puVar1[1];
        auVar32[2] = puVar2[2] + puVar1[2];
        auVar32[3] = puVar2[3] + puVar1[3];
        auVar32[4] = puVar2[4] + puVar1[4];
        auVar32[5] = puVar2[5] + puVar1[5];
        auVar32[6] = puVar2[6] + puVar1[6];
        auVar32[7] = puVar2[7] + puVar1[7];
        auVar32[8] = puVar2[8] + puVar1[8];
        auVar32[9] = puVar2[9] + puVar1[9];
        auVar32[10] = puVar2[10] + puVar1[10];
        auVar32[0xb] = puVar2[0xb] + puVar1[0xb];
        auVar32[0xc] = puVar2[0xc] + puVar1[0xc];
        auVar32[0xd] = puVar2[0xd] + puVar1[0xd];
        auVar32[0xe] = puVar2[0xe] + puVar1[0xe];
        auVar32[0xf] = puVar2[0xf] + puVar1[0xf];
        auVar9 = pshufb(auVar32,ZEXT816(0xe0c0a0806040200));
        auVar18 = pshufb(auVar32,ZEXT816(0xf0d0b0907050301));
        auVar32 = auVar18 & auVar9;
        auVar18 = auVar18 ^ auVar9;
        auVar19._0_2_ = auVar18._0_2_ >> 1;
        auVar19._2_2_ = auVar18._2_2_ >> 1;
        auVar19._4_2_ = auVar18._4_2_ >> 1;
        auVar19._6_2_ = auVar18._6_2_ >> 1;
        auVar19._8_2_ = auVar18._8_2_ >> 1;
        auVar19._10_2_ = auVar18._10_2_ >> 1;
        auVar19._12_2_ = auVar18._12_2_ >> 1;
        auVar19._14_2_ = auVar18._14_2_ >> 1;
        auVar19 = auVar19 & auVar4;
        auVar20[0] = auVar19[0] + auVar32[0];
        auVar20[1] = auVar19[1] + auVar32[1];
        auVar20[2] = auVar19[2] + auVar32[2];
        auVar20[3] = auVar19[3] + auVar32[3];
        auVar20[4] = auVar19[4] + auVar32[4];
        auVar20[5] = auVar19[5] + auVar32[5];
        auVar20[6] = auVar19[6] + auVar32[6];
        auVar20[7] = auVar19[7] + auVar32[7];
        auVar20[8] = auVar19[8] + auVar32[8];
        auVar20[9] = auVar19[9] + auVar32[9];
        auVar20[10] = auVar19[10] + auVar32[10];
        auVar20[0xb] = auVar19[0xb] + auVar32[0xb];
        auVar20[0xc] = auVar19[0xc] + auVar32[0xc];
        auVar20[0xd] = auVar19[0xd] + auVar32[0xd];
        auVar20[0xe] = auVar19[0xe] + auVar32[0xe];
        auVar20[0xf] = auVar19[0xf] + auVar32[0xf];
        auVar9 = pmovzxbw(auVar9,auVar20);
        sVar8 = pavgw(auVar9._0_2_,0);
        sVar10 = pavgw(auVar9._2_2_,0);
        sVar11 = pavgw(auVar9._4_2_,0);
        sVar12 = pavgw(auVar9._6_2_,0);
        sVar13 = pavgw(auVar9._8_2_,0);
        sVar14 = pavgw(auVar9._10_2_,0);
        sVar15 = pavgw(auVar9._12_2_,0);
        sVar16 = pavgw(auVar9._14_2_,0);
        auVar9 = *(undefined1 (*) [16])(src0 + lVar6);
        puVar3 = src1 + lVar6;
        auVar35._8_8_ =
             (undefined8)
             (CONCAT64(CONCAT42(CONCAT22(auVar7._6_2_ - sVar12,sVar12),auVar7._4_2_ - sVar11),
                       CONCAT22(sVar11,sVar12)) >> 0x10);
        auVar35._6_2_ = auVar7._2_2_ - sVar10;
        auVar35._4_2_ = sVar10;
        auVar35._2_2_ = auVar7._0_2_ - sVar8;
        auVar35._0_2_ = sVar8;
        auVar18._2_2_ = auVar7._8_2_ - sVar13;
        auVar18._0_2_ = sVar13;
        auVar18._4_2_ = sVar14;
        auVar18._6_2_ = auVar7._10_2_ - sVar14;
        auVar18._8_2_ = sVar15;
        auVar18._10_2_ = auVar7._12_2_ - sVar15;
        auVar18._12_2_ = sVar16;
        auVar18._14_2_ = auVar7._14_2_ - sVar16;
        auVar24._0_12_ = auVar9._0_12_;
        auVar24._12_2_ = auVar9._6_2_;
        auVar24._14_2_ = puVar3[3];
        auVar23._12_4_ = auVar24._12_4_;
        auVar23._0_10_ = auVar9._0_10_;
        auVar23._10_2_ = puVar3[2];
        auVar22._10_6_ = auVar23._10_6_;
        auVar22._0_8_ = auVar9._0_8_;
        auVar22._8_2_ = auVar9._4_2_;
        auVar21._8_8_ = auVar22._8_8_;
        auVar21._6_2_ = puVar3[1];
        auVar21._4_2_ = auVar9._2_2_;
        auVar21._0_2_ = auVar9._0_2_;
        auVar21._2_2_ = *puVar3;
        auVar32 = pmaddwd(auVar21,auVar35);
        auVar33._2_2_ = puVar3[4];
        auVar33._0_2_ = auVar9._8_2_;
        auVar33._4_2_ = auVar9._10_2_;
        auVar33._6_2_ = puVar3[5];
        auVar33._8_2_ = auVar9._12_2_;
        auVar33._10_2_ = puVar3[6];
        auVar33._12_2_ = auVar9._14_2_;
        auVar33._14_2_ = puVar3[7];
        auVar18 = pmaddwd(auVar33,auVar18);
        auVar9._0_4_ = auVar32._0_4_ >> 5;
        auVar9._4_4_ = auVar32._4_4_ >> 5;
        auVar9._8_4_ = auVar32._8_4_ >> 5;
        auVar9._12_4_ = auVar32._12_4_ >> 5;
        auVar34._0_4_ = auVar18._0_4_ >> 5;
        auVar34._4_4_ = auVar18._4_4_ >> 5;
        auVar34._8_4_ = auVar18._8_4_ >> 5;
        auVar34._12_4_ = auVar18._12_4_ >> 5;
        auVar9 = packssdw(auVar9,auVar34);
        uVar17 = pavgw(auVar9._0_2_,0);
        uVar25 = pavgw(auVar9._2_2_,0);
        uVar26 = pavgw(auVar9._4_2_,0);
        uVar27 = pavgw(auVar9._6_2_,0);
        uVar28 = pavgw(auVar9._8_2_,0);
        uVar29 = pavgw(auVar9._10_2_,0);
        uVar30 = pavgw(auVar9._12_2_,0);
        uVar31 = pavgw(auVar9._14_2_,0);
        puVar3 = dst + lVar6;
        *puVar3 = uVar17;
        puVar3[1] = uVar25;
        puVar3[2] = uVar26;
        puVar3[3] = uVar27;
        puVar3[4] = uVar28;
        puVar3[5] = uVar29;
        puVar3[6] = uVar30;
        puVar3[7] = uVar31;
        lVar6 = lVar6 + 8;
      } while ((int)lVar6 < w);
    }
    mask = mask + mask_stride * 2;
    dst = dst + dst_stride;
    src1 = src1 + src1_stride;
    src0 = src0 + src0_stride;
    puVar5 = puVar5 + mask_stride * 2;
    h = h + -1;
  } while (h != 0);
  return;
}

Assistant:

static void blend_a64_mask_b12_sx_sy_w8n_sse4_1(
    uint16_t *dst, uint32_t dst_stride, const uint16_t *src0,
    uint32_t src0_stride, const uint16_t *src1, uint32_t src1_stride,
    const uint8_t *mask, uint32_t mask_stride, int w, int h) {
  blend_a64_mask_bn_sx_sy_w8n_sse4_1(dst, dst_stride, src0, src0_stride, src1,
                                     src1_stride, mask, mask_stride, w, h,
                                     blend_8_b12);
}